

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

int trim_cache(svm_params *params)

{
  ulong *puVar1;
  int iVar2;
  svm_example **ppsVar3;
  size_t sVar4;
  long in_RDI;
  svm_example *e;
  size_t i;
  int alloc;
  size_t n;
  svm_model *model;
  int sz;
  svm_example *local_30;
  int local_24;
  svm_example *this;
  int local_c;
  
  local_c = (int)*(undefined8 *)(in_RDI + 0x40);
  puVar1 = *(ulong **)(in_RDI + 0x38);
  this = (svm_example *)*puVar1;
  local_24 = 0;
  for (local_30 = (svm_example *)0x0; local_30 < this;
      local_30 = (svm_example *)((long)&(local_30->krow)._begin + 1)) {
    ppsVar3 = v_array<svm_example_*>::operator[]
                        ((v_array<svm_example_*> *)(puVar1 + 1),(size_t)local_30);
    sVar4 = v_array<float>::size(&(*ppsVar3)->krow);
    local_c = local_c - (int)sVar4;
    if (local_c < 0) {
      iVar2 = svm_example::clear_kernels(this);
      local_24 = iVar2 + local_24;
    }
  }
  return local_24;
}

Assistant:

static int trim_cache(svm_params& params)
{
  int sz = (int)params.maxcache;
  svm_model* model = params.model;
  size_t n = model->num_support;
  int alloc = 0;
  for (size_t i = 0; i < n; i++)
  {
    svm_example* e = model->support_vec[i];
    sz -= (int)e->krow.size();
    if (sz < 0)
      alloc += e->clear_kernels();
  }
  return alloc;
}